

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# options_serializer_boost_po.h
# Opt level: O1

void __thiscall
VW::config::options_serializer_boost_po::serialize<double>
          (options_serializer_boost_po *this,
          typed_option<std::vector<double,_std::allocator<double>_>_> *typed_option)

{
  vector<double,_std::allocator<double>_> *__x;
  pointer pdVar1;
  iterator __begin0;
  pointer pdVar2;
  undefined1 *puVar3;
  vector<double,_std::allocator<double>_> vec;
  vector<double,_std::allocator<double>_> local_48;
  
  __x = (typed_option->m_value).
        super___shared_ptr<std::vector<double,_std::allocator<double>_>,_(__gnu_cxx::_Lock_policy)2>
        ._M_ptr;
  if (__x == (vector<double,_std::allocator<double>_> *)0x0) {
    local_48.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_start = (double *)0x0;
    local_48.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_finish = (double *)0x0;
    local_48.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)0x0;
  }
  else {
    std::vector<double,_std::allocator<double>_>::vector(&local_48,__x);
  }
  pdVar1 = local_48.super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_finish;
  if (local_48.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_finish !=
      local_48.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start) {
    puVar3 = &this->field_0x18;
    pdVar2 = local_48.super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
    do {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)puVar3," --",3);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)puVar3,(typed_option->super_base_option).m_name._M_dataplus._M_p,
                 (typed_option->super_base_option).m_name._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)puVar3," ",1);
      std::ostream::_M_insert<double>(*pdVar2);
      pdVar2 = pdVar2 + 1;
    } while (pdVar2 != pdVar1);
  }
  if (local_48.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start != (double *)0x0) {
    operator_delete(local_48.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void serialize(typed_option<std::vector<T>>& typed_option)
  {
    auto vec = typed_option.value();
    if (vec.size() > 0)
    {
      for (auto const& value : vec)
      {
        m_output_stream << " --" << typed_option.m_name;
        m_output_stream << " " << value;
      }
    }
  }